

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StereoMatching.hpp
# Opt level: O3

Mat * bgr_to_grey(Mat *bgr)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long in_RSI;
  long lVar6;
  
  uVar1 = (*(int **)(in_RSI + 0x40))[1];
  iVar2 = **(int **)(in_RSI + 0x40);
  cv::Mat::Mat(bgr,iVar2,uVar1,0);
  if (0 < (long)iVar2) {
    lVar3 = 0;
    do {
      if (0 < (int)uVar1) {
        lVar4 = 1;
        uVar5 = 0;
        do {
          lVar6 = **(long **)(in_RSI + 0x48) * lVar3 + *(long *)(in_RSI + 0x10);
          *(char *)(uVar5 + **(long **)(bgr + 0x48) * lVar3 + *(long *)(bgr + 0x10)) =
               (char)(int)((double)*(byte *)(lVar4 + lVar6) * 0.333) +
               (char)(int)((double)*(byte *)(lVar4 + 1 + lVar6) * 0.333) +
               (char)(int)((double)*(byte *)(lVar4 + -1 + lVar6) * 0.333);
          uVar5 = uVar5 + 1;
          lVar4 = lVar4 + 3;
        } while (uVar1 != uVar5);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != iVar2);
  }
  return bgr;
}

Assistant:

Mat
bgr_to_grey(const Mat& bgr)
{
    int width = bgr.size().width;
    int height = bgr.size().height;
    Mat grey(height, width, 0);

    for (int y = 0; y < height; y++)
    {
        for (int x = 0; x < width; x++)
        {
            uchar r = 0.333 * bgr.at<Vec3b>(y, x)[2];
            uchar g = 0.333 * bgr.at<Vec3b>(y, x)[1];
            uchar b = 0.333 * bgr.at<Vec3b>(y, x)[0];
            grey.at<uchar>(y, x) = uchar(r + g + b);
        }
    }

    return grey;
}